

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O0

void __thiscall asl::HttpMessage::readBody(HttpMessage *this)

{
  Socket *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  HttpSink *pHVar4;
  HttpStatus *pHVar5;
  ssize_t sVar6;
  size_t __nbytes;
  undefined1 local_3f88 [8];
  String chunkSize;
  int bytesRead;
  int maxToRead;
  byte buffer [16000];
  int av;
  String local_c8;
  String local_b0;
  byte local_91;
  undefined1 local_90 [7];
  bool end;
  String local_78;
  byte local_59;
  int local_58;
  bool chunked;
  int currentsize;
  String local_48;
  String local_30;
  uint local_14;
  HttpMessage *pHStack_10;
  int size;
  HttpMessage *this_local;
  
  pHStack_10 = this;
  asl::String::String(&local_48,"Content-Length");
  header(&local_30,this,&local_48);
  uVar2 = asl::String::operator_cast_to_int(&local_30);
  asl::String::~String(&local_30);
  asl::String::~String(&local_48);
  local_58 = 0;
  local_14 = uVar2;
  asl::String::String((String *)local_90,"Transfer-Encoding");
  header(&local_78,this,(String *)local_90);
  bVar1 = asl::String::operator==(&local_78,"chunked");
  asl::String::~String(&local_78);
  asl::String::~String((String *)local_90);
  local_59 = bVar1;
  pHVar4 = Shared<asl::HttpSink>::operator->(&this->_sink);
  (*pHVar4->_vptr_HttpSink[4])(pHVar4,(ulong)local_14);
  Socket::setBlocking(this->_socket,true);
  local_91 = 0;
  asl::String::String(&local_b0,"Content-Length");
  bVar1 = hasHeader(this,&local_b0);
  asl::String::~String(&local_b0);
  if (bVar1) {
    asl::String::String((String *)&stack0xffffffffffffff20,"Content-Length");
    header(&local_c8,this,(String *)&stack0xffffffffffffff20);
    bVar1 = asl::String::operator==(&local_c8,"0");
    asl::String::~String(&local_c8);
    asl::String::~String((String *)&stack0xffffffffffffff20);
    if (bVar1) {
      return;
    }
  }
  else if ((local_59 & 1) == 0) {
    return;
  }
  uVar2 = local_14;
  pHVar5 = Shared<asl::HttpStatus>::operator->(&this->_status);
  __nbytes = (size_t)uVar2;
  pHVar5->totalReceive = uVar2;
  pHVar5 = Shared<asl::HttpStatus>::operator->(&this->_status);
  pHVar5->received = 0;
  do {
    if (((((local_91 ^ 0xff) & 1) == 0) ||
        (buffer._15996_4_ = Socket::available(this->_socket), (int)buffer._15996_4_ < 0)) ||
       (bVar1 = Socket::waitInput(this->_socket,10.0), !bVar1)) {
      return;
    }
    chunkSize.field_2._12_4_ = Socket::available(this->_socket);
    chunkSize.field_2._8_4_ = 0;
    if ((local_59 & 1) != 0) {
      Socket::readLine((String *)local_3f88,this->_socket);
      chunkSize.field_2._12_4_ = asl::String::hexToInt((String *)local_3f88);
      if (chunkSize.field_2._12_4_ == 0) {
        local_91 = 1;
      }
      asl::String::~String((String *)local_3f88);
    }
    while (0 < (int)chunkSize.field_2._12_4_) {
      this_00 = this->_socket;
      uVar2 = min<int>(chunkSize.field_2._12_4_,16000);
      sVar6 = Socket::read(this_00,(int)&bytesRead,(void *)(ulong)uVar2,__nbytes);
      chunkSize.field_2._8_4_ = (undefined4)sVar6;
      if ((int)chunkSize.field_2._8_4_ < 1) {
        return;
      }
      iVar3 = chunkSize.field_2._8_4_ + local_58;
      local_58 = iVar3;
      pHVar5 = Shared<asl::HttpStatus>::operator->(&this->_status);
      pHVar5->received = iVar3;
      pHVar4 = Shared<asl::HttpSink>::operator->(&this->_sink);
      (*pHVar4->_vptr_HttpSink[2])(pHVar4,&bytesRead,(ulong)(uint)chunkSize.field_2._8_4_);
      bVar1 = Function::operator_cast_to_bool((Function *)&this->_progress);
      if (bVar1) {
        pHVar5 = Shared<asl::HttpStatus>::operator*(&this->_status);
        Function<void,_const_asl::HttpStatus_&,_asl::NoType>::operator()(&this->_progress,pHVar5);
      }
      chunkSize.field_2._12_4_ = chunkSize.field_2._12_4_ - chunkSize.field_2._8_4_;
      if ((local_14 != 0) && (local_14 = local_14 - chunkSize.field_2._8_4_, (int)local_14 < 1)) {
        return;
      }
      __nbytes = (size_t)(uint)chunkSize.field_2._8_4_;
    }
    if (((local_59 & 1) != 0) &&
       (sVar6 = Socket::read(this->_socket,(int)&bytesRead,(void *)0x2,__nbytes), (int)sVar6 < 2)) {
      return;
    }
  } while( true );
}

Assistant:

void HttpMessage::readBody()
{
	int size = header("Content-Length");

	int currentsize = 0;

	bool chunked = header("Transfer-Encoding") == "chunked"; // Handle specially!!

	_sink->init(size);

	_socket->setBlocking(true);

	bool end = false;

	if (hasHeader("Content-Length")) {
		if (header("Content-Length") == "0")
			return;
	}
	else if(!chunked)
		return;

	_status->totalReceive = size;
	_status->received = 0;

	while (!end)
	{
		int av = _socket->available();
		if (av < 0 || !_socket->waitInput(10)) {
			break;
		}
		byte buffer[RECV_BLOCK_SIZE];
		int maxToRead = _socket->available(), bytesRead = 0;
		if (chunked)
		{
			String chunkSize = _socket->readLine();
			maxToRead = chunkSize.hexToInt();
			if (maxToRead == 0)
				end = true;
		}
		while (maxToRead > 0) {
			bytesRead = _socket->read(buffer, min(maxToRead, (int)sizeof(buffer)));
			if (bytesRead <= 0) {
				return;
			}
			currentsize += bytesRead;
			_status->received = currentsize;
			_sink->write(buffer, bytesRead);
			if(_progress)
				_progress(*_status);
			maxToRead -= bytesRead;
			if (size) {
				size -= bytesRead;
				if (size <= 0) {
					return;
				}
			}
		}
		//if (maxToRead == 0) // ANDROID ?
		//	break;

		if (chunked)
		{
			if (_socket->read(buffer, 2) < 2) // skip crlf
				break;
		}
	}
	//printf("readbody end\n");
}